

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCatch v",8);
  operator<<((ostream *)&std::cout,(Version *)libraryVersion);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"For more detail usage please see the project docs\n",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void showHelp(std::string const& processName) {
			Catch::cout() << "\nCatch v" << libraryVersion << "\n";

			m_cli.usage(Catch::cout(), processName);
			Catch::cout() << "For more detail usage please see the project docs\n" << std::endl;
		}